

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Dch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Dch_Pars_t Pars;
  
  Dch_ManSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
LAB_0022046e:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WCSsptfrvh");
    iVar3 = globalUtilOptind;
    switch(iVar1) {
    case 0x70:
      Pars.fPower = Pars.fPower ^ 1;
      goto LAB_0022046e;
    case 0x71:
    case 0x75:
      goto switchD_0022048a_caseD_71;
    case 0x72:
      Pars.fSkipRedSupp = Pars.fSkipRedSupp ^ 1;
      goto LAB_0022046e;
    case 0x73:
      Pars.fSynthesis = Pars.fSynthesis ^ 1;
      goto LAB_0022046e;
    case 0x74:
      Pars.fSimulateTfo = Pars.fSimulateTfo ^ 1;
      goto LAB_0022046e;
    case 0x76:
      Pars.fVerbose = Pars.fVerbose ^ 1;
      goto LAB_0022046e;
    }
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0022056e:
        Abc_Print(-1,pcVar4);
        goto switchD_0022048a_caseD_71;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nBTLimit = iVar1;
    }
    else if (iVar1 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0022056e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nSatVarMax = iVar1;
    }
    else {
      if (iVar1 != 0x57) {
        if (iVar1 != 0x66) {
          if (iVar1 == -1) {
            pGVar2 = pAbc->pGia;
            if (pGVar2 == (Gia_Man_t *)0x0) {
              pcVar4 = "Abc_CommandAbc9Dch(): There is no AIG.\n";
            }
            else {
              if (pGVar2->nBufs == 0) {
                pGVar2 = Gia_ManPerformDch(pGVar2,&Pars);
                Abc_FrameUpdateGia(pAbc,pGVar2);
                return 0;
              }
              pcVar4 = "Abc_CommandAbc9Dch(): This command does not work with barrier buffers.\n";
            }
            iVar3 = -1;
            goto LAB_00220695;
          }
          goto switchD_0022048a_caseD_71;
        }
        Pars.fLightSynth = Pars.fLightSynth ^ 1;
        goto LAB_0022046e;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0022056e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nWords = iVar1;
    }
    globalUtilOptind = iVar3 + 1;
    if (iVar1 < 0) {
switchD_0022048a_caseD_71:
      iVar3 = -2;
      Abc_Print(-2,"usage: &dch [-WCS num] [-sptfrvh]\n");
      Abc_Print(-2,"\t         computes structural choices using a new approach\n");
      Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nBTLimit);
      Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                (ulong)(uint)Pars.nSatVarMax);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (Pars.fSynthesis == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle synthesizing three snapshots [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fPower == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fSimulateTfo == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fLightSynth == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle using lighter logic synthesis [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fSkipRedSupp == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle skipping choices with redundant support [default = %s]\n",
                pcVar4);
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_00220695:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Dch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    int c;
    // set defaults
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCSsptfrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 's':
            pPars->fSynthesis ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'f':
            pPars->fLightSynth ^= 1;
            break;
        case 'r':
            pPars->fSkipRedSupp ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): This command does not work with barrier buffers.\n" );
        return 1;
    }
    pTemp = Gia_ManPerformDch( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dch [-WCS num] [-sptfrvh]\n" );
    Abc_Print( -2, "\t         computes structural choices using a new approach\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-s     : toggle synthesizing three snapshots [default = %s]\n", pPars->fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle using lighter logic synthesis [default = %s]\n", pPars->fLightSynth? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle skipping choices with redundant support [default = %s]\n", pPars->fSkipRedSupp? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}